

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

bool __thiscall PInt::ReadValue(PInt *this,FSerializer *ar,char *key,void *addr)

{
  undefined1 local_40 [8];
  NumericValue val;
  void *addr_local;
  char *key_local;
  FSerializer *ar_local;
  PInt *this_local;
  
  val.field_1 = (anon_union_8_3_1b0c0a0a_for_NumericValue_2)addr;
  FSerializer::operator()(ar,key,(NumericValue *)local_40);
  if (local_40._0_4_ == NM_invalid) {
    this_local._7_1_ = false;
  }
  else {
    if (local_40._0_4_ == NM_float) {
      val._0_8_ = (BADTYPE)(double)val._0_8_;
    }
    switch(*(undefined4 *)&this->field_0x24) {
    case 1:
      *(char *)val.field_1 = (char)val.type;
      break;
    case 2:
      *(short *)val.field_1 = (short)val.type;
      break;
    default:
      return false;
    case 4:
      *(EType *)val.field_1 = val.type;
      break;
    case 8:
      *(undefined8 *)val.field_1 = val._0_8_;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool PInt::ReadValue(FSerializer &ar, const char *key, void *addr) const
{
	NumericValue val;

	ar(key, val);
	if (val.type == NumericValue::NM_invalid) return false;	// not found or usable
	if (val.type == NumericValue::NM_float) val.signedval = (int64_t)val.floatval;

	// No need to check the unsigned state here. Downcasting to smaller types will yield the same result for both.
	switch (Size)
	{
	case 1:
		*(uint8_t*)addr = (uint8_t)val.signedval;
		break;

	case 2:
		*(uint16_t*)addr = (uint16_t)val.signedval;
		break;

	case 4:
		*(uint32_t*)addr = (uint32_t)val.signedval;
		break;

	case 8:
		*(uint64_t*)addr = (uint64_t)val.signedval;
		break;

	default:
		return false;	// something invalid
	}

	return true;
}